

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

void NULLCCanvas::CanvasDrawLineAA(double x1,double y1,double x2,double y2,Canvas *ptr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  dVar8 = x2 - x1;
  dVar10 = y2 - y1;
  auVar12._0_8_ = -dVar8;
  auVar12._8_8_ = -dVar10;
  auVar13._8_8_ = dVar10;
  auVar13._0_8_ = dVar8;
  auVar13 = maxpd(auVar12,auVar13);
  dVar14 = auVar13._8_8_;
  dVar11 = auVar13._0_8_;
  dVar7 = x2;
  dVar9 = dVar10;
  dVar5 = x1;
  if (dVar11 < dVar14) {
    dVar7 = y2;
    dVar9 = dVar8;
    dVar8 = dVar10;
    dVar5 = y1;
    y1 = x1;
    y2 = x2;
  }
  dVar10 = y1;
  dVar6 = dVar5;
  if (dVar7 < dVar5) {
    dVar10 = y2;
    dVar6 = dVar7;
    dVar7 = dVar5;
    y2 = y1;
  }
  if (dVar6 < 0.0) {
    if (dVar7 < 0.0) {
      return;
    }
    dVar5 = -dVar6 / (dVar7 - dVar6);
    dVar10 = dVar10 * (1.0 - dVar5) + dVar5 * y2;
    dVar6 = 0.0;
  }
  dVar5 = (double)(int)ptr->color[(ulong)(dVar11 < dVar14) - 2];
  if (dVar6 <= dVar5) {
    dVar1 = dVar6 + 0.5;
    dVar9 = dVar9 / dVar8;
    dVar10 = ((double)(int)dVar1 - dVar6) * dVar9 + dVar10;
    dVar8 = floor(dVar1);
    uVar4 = (uint)dVar10;
    dVar6 = floor(dVar10);
    if (dVar7 <= dVar5) {
      dVar5 = dVar7;
    }
    uVar2 = (uint)dVar1;
    dVar8 = (dVar8 - dVar1) + 1.0;
    dVar7 = ((dVar6 - dVar10) + 1.0) * dVar8;
    if (dVar14 <= dVar11) {
      CanvasDrawPointInternal(uVar2,uVar4,dVar7,ptr);
      uVar3 = uVar4 + 1;
      uVar4 = uVar2;
    }
    else {
      CanvasDrawPointInternal(uVar4,uVar2,dVar7,ptr);
      uVar3 = uVar2;
      uVar4 = uVar4 + 1;
    }
    CanvasDrawPointInternal(uVar4,uVar3,(dVar10 - dVar6) * dVar8,ptr);
    dVar1 = dVar5 + 0.5;
    dVar7 = ((double)(int)dVar1 - dVar5) * dVar9 + y2;
    dVar8 = floor(dVar1);
    uVar4 = (uint)dVar7;
    dVar5 = floor(dVar7);
    uVar2 = uVar2 + 1;
    dVar10 = dVar10 + dVar9;
    uVar3 = (uint)dVar1;
    dVar6 = ((dVar5 - dVar7) + 1.0) * (dVar1 - dVar8);
    dVar7 = (dVar7 - dVar5) * (dVar1 - dVar8);
    if (dVar14 <= dVar11) {
      CanvasDrawPointInternal(uVar3,uVar4,dVar6,ptr);
      CanvasDrawPointInternal(uVar3,uVar4 + 1,dVar7,ptr);
      if ((int)uVar2 < (int)uVar3) {
        do {
          dVar7 = floor(dVar10);
          CanvasDrawPointInternal(uVar2,(int)dVar10,(dVar7 - dVar10) + 1.0,ptr);
          CanvasDrawPointInternal(uVar2,(int)dVar10 + 1,dVar10 - dVar7,ptr);
          dVar10 = dVar10 + dVar9;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
    }
    else {
      CanvasDrawPointInternal(uVar4,uVar3,dVar6,ptr);
      CanvasDrawPointInternal(uVar4 + 1,uVar3,dVar7,ptr);
      if ((int)uVar2 < (int)uVar3) {
        do {
          dVar7 = floor(dVar10);
          CanvasDrawPointInternal((int)dVar10,uVar2,(dVar7 - dVar10) + 1.0,ptr);
          CanvasDrawPointInternal((int)dVar10 + 1,uVar2,dVar10 - dVar7,ptr);
          dVar10 = dVar10 + dVar9;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawLineAA(double x1, double y1, double x2, double y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		double dx = x2 - x1;
		double dy = y2 - y1;
		bool steep = false;
		if(abs(dx) < abs(dy))
		{			
			swap(x1, y1);
			swap(x2, y2);
			swap(dx, dy);
			steep = true;
		}
		if(x2 < x1)
		{
			swap(x1, x2);
			swap(y1, y2);
		}
		if(x1 < 0.0)
		{
			if(x2 < 0.0)
				return;
			double l = -x1 / (x2 - x1);
			x1 = 0.0;
			y1 = y1 * (1.0 - l) + y2 * l;
		}
		if(x1 > (steep ? ptr->height : ptr->width))
			return;
		if(x2 > (steep ? ptr->height : ptr->width))
			x2 = steep ? ptr->height : ptr->width;
		double gradient = dy / dx;

		// handle first endpoint
		int xend = round(x1);
		double yend = y1 + gradient * (xend - x1);
		double xgap = rfpart(x1 + 0.5);
		int xpxl1 = xend;
		int ypxl1 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl1, xpxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl1 + 1, xpxl1, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl1, ypxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl1, ypxl1 + 1, fpart(yend) * xgap, ptr);
		}
		double intery = yend + gradient; // first y-intersection for the main loop

		// handle second endpoint
		xend = round(x2);
		yend = y2 + gradient * (xend - x2);
		xgap = fpart(x2 + 0.5);
		int xpxl2 = xend ; // this will be used in the main loop
		int ypxl2 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl2, xpxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl2 + 1, xpxl2, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl2, ypxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl2, ypxl2 + 1, fpart(yend) * xgap, ptr);
		}

		if(steep)
		{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(int(intery), x, rfpart(intery), ptr);
				CanvasDrawPointInternal(int(intery) + 1, x, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}else{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(x, int(intery), rfpart(intery), ptr);
				CanvasDrawPointInternal(x, int(intery) + 1, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}
	}